

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sx1231_kaku.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  int ret;
  int unit;
  uint32_t addr;
  char *tmp;
  anon_enum_32 button;
  uchar kaku_data [4];
  rf_dev_t dev;
  char *dev_path;
  int opt;
  char **argv_local;
  int argc_local;
  
  dev = (rf_dev_t)anon_var_dwarf_42;
  while (iVar1 = __posix_getopt(argc,argv,"d:h"), iVar1 != -1) {
    if (iVar1 != 100) {
      if (iVar1 == 0x68) {
        usage(*argv);
        exit(0);
      }
      usage(*argv);
      exit(1);
    }
    dev = _optarg;
  }
  if (argc - _optind != 3) {
    fprintf(_stderr,"Incorrect amount of arguments\n");
    usage(*argv);
    exit(1);
  }
  lVar4 = strtol(argv[_optind],(char **)&unit,0x10);
  uVar3 = (uint)lVar4;
  if (*_unit != '\0') {
    fprintf(_stderr,"Unparsable characters in address argument\n");
    exit(1);
  }
  _optind = _optind + 1;
  lVar4 = strtol(argv[_optind],(char **)&unit,0);
  if (*_unit != '\0') {
    fprintf(_stderr,"Unparsable characters in unit argument\n");
    exit(1);
  }
  if ((0xf < (int)lVar4) || ((int)lVar4 < 0)) {
    fprintf(_stderr,"Unit number out of range(0-15)\n");
    exit(1);
  }
  _optind = _optind + 1;
  iVar1 = strcmp(argv[_optind],"on");
  if (iVar1 == 0) {
    tmp._0_4_ = 0;
  }
  else {
    iVar1 = strcmp(argv[_optind],"off");
    if (iVar1 != 0) {
      fprintf(_stderr,"Unknown direction argument\n");
      exit(1);
    }
    tmp._0_4_ = 1;
  }
  iVar1 = rf_open((rf_dev_t *)&button,(char *)dev);
  if (iVar1 == 0) {
    uVar2 = rf_config((rf_dev_t *)&button,433.92,0.0,1,26.666666666666668);
    if (uVar2 != 0) {
      fprintf(_stderr,"ERROR: Failed configuring module: %d\n",(ulong)uVar2);
      rf_close((rf_dev_t *)&button);
      exit(1);
    }
    tmp._4_1_ = (undefined1)(uVar3 >> 0x12);
    tmp._5_1_ = (undefined1)(uVar3 >> 10);
    tmp._6_1_ = (undefined1)(uVar3 >> 2);
    tmp._7_1_ = (byte)(uVar3 << 6);
    if ((int)tmp == 0) {
      tmp._7_1_ = tmp._7_1_ | 0x10;
    }
    tmp._7_1_ = tmp._7_1_ | (byte)lVar4 & 0xf;
    uVar3 = kaku_send((rf_dev_t *)&button,(uint8_t *)((long)&tmp + 4));
    rf_close((rf_dev_t *)&button);
    if (uVar3 == 0) {
      return 0;
    }
    fprintf(_stderr,"ERROR: Failed sending command: %d\n",(ulong)uVar3);
    exit(1);
  }
  exit(1);
}

Assistant:

int main(int argc, char *argv[])
{
	int opt;
	const char *dev_path = DEFAULT_DEV_PATH;
	rf_dev_t dev;
	unsigned char kaku_data[4];
	enum { ButtonOn, ButtonOff } button;
	char *tmp;
	uint32_t addr;
	int unit;
	int ret;

	while ((opt = getopt(argc, argv, "d:h")) != -1) {
		switch (opt) {
		case 'd':
			dev_path = optarg;
			break;
		case 'h':
			usage(argv[0]);
			exit(EXIT_SUCCESS);
			break;
		default: /* '?' */
			usage(argv[0]);
			exit(EXIT_FAILURE);
		}
	}
	
	if (argc - optind != 3) {
		fprintf(stderr, "Incorrect amount of arguments\n");
		usage(argv[0]);
		exit(EXIT_FAILURE);
	}

	addr = strtol(argv[optind], &tmp, 16);
	if (*tmp != '\0') {
		fprintf(stderr, "Unparsable characters in address argument\n");
		exit(EXIT_FAILURE);
	}
	optind++;

	unit = strtol(argv[optind], &tmp, 0);
	if (*tmp != '\0') {
		fprintf(stderr, "Unparsable characters in unit argument\n");
		exit(EXIT_FAILURE);
	}
	if (unit > 0xf || unit < 0) {
		fprintf(stderr, "Unit number out of range(0-15)\n");
		exit(EXIT_FAILURE);
	}
	optind++;

	if (strcmp(argv[optind], "on") == 0) {
		button = ButtonOn;
	} else if (strcmp(argv[optind], "off") == 0) {
		button = ButtonOff;
	} else {
		fprintf(stderr, "Unknown direction argument\n");
		exit(EXIT_FAILURE);
	}

	// Open SX1231
	if (rf_open(&dev, dev_path) != 0) {
		exit(EXIT_FAILURE);
	}

	ret = rf_config(&dev, 433.92, 0, SX1231_MODULATION_OOK, ENCODED_BITRATE);
	if (ret != ERR_OK) {
		fprintf(stderr, "ERROR: Failed configuring module: %d\n", ret);
		rf_close(&dev);
		exit(EXIT_FAILURE);
	}

	// encode KAKU frame data
	kaku_data[0] = addr >> 18;
	kaku_data[1] = addr >> 10;
	kaku_data[2] = addr >> 2;
	kaku_data[3] = (addr << 6) & 0xc0;
	if (button == ButtonOn) {
		kaku_data[3] |= 0x10;
	} else {
		kaku_data[3] &= ~0x10;
	}
	kaku_data[3] = (kaku_data[3] & 0xF0) | (unit & 0x0F);

	// send frame
	ret = kaku_send(&dev, kaku_data);

	rf_close(&dev);

	if (ret != ERR_OK) {
		fprintf(stderr, "ERROR: Failed sending command: %d\n", ret);
		exit(EXIT_FAILURE);
	}

	return EXIT_SUCCESS;
}